

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O2

QString * __thiscall
QLocalSocketPrivate::generateErrorString
          (QString *__return_storage_ptr__,QLocalSocketPrivate *this,LocalSocketError error,
          QString *function)

{
  Data *pDVar1;
  int *piVar2;
  char *s;
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  this_01 = &QStack_78;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(error) {
  case ConnectionRefusedError:
    s = "%1: Connection refused";
    break;
  case PeerClosedError:
    s = "%1: Remote closed";
    break;
  case ServerNotFoundError:
    s = "%1: Invalid name";
    break;
  case SocketAccessError:
    s = "%1: Socket access error";
    break;
  case SocketResourceError:
    s = "%1: Socket resource error";
    break;
  case SocketTimeoutError:
    s = "%1: Socket operation timed out";
    break;
  case DatagramTooLargeError:
    s = "%1: Datagram too large";
    break;
  case ConnectionError:
    s = "%1: Connection error";
    break;
  default:
    QLocalSocket::tr((QString *)&QStack_78,"%1: Unknown error %2",(char *)0x0,-1);
    this_00 = &local_60;
    QString::arg<QString,_true>((QString *)this_00,(QString *)&QStack_78,function,0,(QChar)0x20);
    piVar2 = __errno_location();
    QString::arg<int,_true>((QString *)&local_48,(QString *)this_00,*piVar2,0,10,(QChar)0x20);
    pDVar1 = local_48.d;
    local_48.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_48.ptr;
    local_48.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_48.size;
    local_48.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    goto LAB_00228421;
  case UnsupportedSocketOperationError:
    s = "%1: The socket operation is not supported";
    break;
  case OperationError:
    s = "%1: Operation not permitted when socket is in this state";
  }
  this_01 = &local_60;
  QLocalSocket::tr((QString *)this_01,s,(char *)0x0,-1);
  this_00 = &local_48;
  QString::arg<QString,_true>((QString *)this_00,(QString *)this_01,function,0,(QChar)0x20);
  pDVar1 = local_48.d;
  local_48.d = (Data *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = local_48.ptr;
  local_48.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = local_48.size;
  local_48.size = 0;
LAB_00228421:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocalSocketPrivate::generateErrorString(QLocalSocket::LocalSocketError error, const QString &function) const
{
    QString errorString;
    switch (error) {
    case QLocalSocket::ConnectionRefusedError:
        errorString = QLocalSocket::tr("%1: Connection refused").arg(function);
        break;
    case QLocalSocket::PeerClosedError:
        errorString = QLocalSocket::tr("%1: Remote closed").arg(function);
        break;
    case QLocalSocket::ServerNotFoundError:
        errorString = QLocalSocket::tr("%1: Invalid name").arg(function);
        break;
    case QLocalSocket::SocketAccessError:
        errorString = QLocalSocket::tr("%1: Socket access error").arg(function);
        break;
    case QLocalSocket::SocketResourceError:
        errorString = QLocalSocket::tr("%1: Socket resource error").arg(function);
        break;
    case QLocalSocket::SocketTimeoutError:
        errorString = QLocalSocket::tr("%1: Socket operation timed out").arg(function);
        break;
    case QLocalSocket::DatagramTooLargeError:
        errorString = QLocalSocket::tr("%1: Datagram too large").arg(function);
        break;
    case QLocalSocket::ConnectionError:
        errorString = QLocalSocket::tr("%1: Connection error").arg(function);
        break;
    case QLocalSocket::UnsupportedSocketOperationError:
        errorString = QLocalSocket::tr("%1: The socket operation is not supported").arg(function);
        break;
    case QLocalSocket::OperationError:
        errorString = QLocalSocket::tr("%1: Operation not permitted when socket is in this state").arg(function);
        break;
    case QLocalSocket::UnknownSocketError:
    default:
        errorString = QLocalSocket::tr("%1: Unknown error %2").arg(function).arg(errno);
    }
    return errorString;
}